

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_residual.c
# Opt level: O2

int h264_residual_cabac(bitstream *str,h264_cabac_context *cabac,h264_slice *slice,
                       h264_macroblock *mb,int32_t *block,int cat,int idx,int start,int end,
                       int maxnumcoeff,int coded)

{
  int *piVar1;
  long lVar2;
  h264_cabac_context *cabac_00;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int numgt1;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint32_t coded_block_flag;
  int local_268;
  int32_t cam1;
  h264_macroblock *local_260;
  h264_cabac_context *local_258;
  uint32_t s;
  ulong local_248;
  ulong local_240;
  uint32_t significant_coeff_flag [64];
  uint32_t last_significant_coeff_flag [64];
  
  coded_block_flag = 0;
  uVar9 = 0;
  uVar11 = 0;
  if (0 < maxnumcoeff) {
    uVar11 = (ulong)(uint)maxnumcoeff;
  }
  for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
    if (block[uVar9] != 0) {
      coded_block_flag = 1;
    }
  }
  local_260 = mb;
  local_258 = cabac;
  if (coded == 0) {
    iVar3 = vs_infer(str,&coded_block_flag,0);
  }
  else {
    if ((maxnumcoeff == 0x40) && (slice->chroma_array_type != 3)) {
      iVar3 = vs_infer(str,&coded_block_flag,1);
      if (iVar3 != 0) {
        return 1;
      }
      goto LAB_0010748f;
    }
    iVar3 = h264_coded_block_flag(str,cabac,cat,idx,&coded_block_flag);
  }
  if (iVar3 != 0) {
    return 1;
  }
LAB_0010748f:
  if (0xd < (uint)cat) {
    abort();
  }
  lVar6 = (long)idx;
  switch(cat) {
  case 0:
    local_260->coded_block_flag[0][0x10] = coded_block_flag;
    break;
  default:
    local_260->coded_block_flag[0][lVar6] = coded_block_flag;
    break;
  case 3:
    local_260->coded_block_flag[idx + 1][0x10] = coded_block_flag;
    break;
  case 4:
    local_260->coded_block_flag[(idx >> 3) + 1][idx & 7] = coded_block_flag;
    break;
  case 5:
    piVar1 = local_260->coded_block_flag[0] + (idx << 2);
    *piVar1 = coded_block_flag;
    piVar1[1] = coded_block_flag;
    piVar1[2] = coded_block_flag;
    piVar1[3] = coded_block_flag;
    break;
  case 6:
    local_260->coded_block_flag[1][0x10] = coded_block_flag;
    break;
  case 7:
  case 8:
    local_260->coded_block_flag[1][lVar6] = coded_block_flag;
    break;
  case 9:
    piVar1 = local_260->coded_block_flag[1] + (idx << 2);
    *piVar1 = coded_block_flag;
    piVar1[1] = coded_block_flag;
    piVar1[2] = coded_block_flag;
    piVar1[3] = coded_block_flag;
    break;
  case 10:
    local_260->coded_block_flag[2][0x10] = coded_block_flag;
    break;
  case 0xb:
  case 0xc:
    local_260->coded_block_flag[2][lVar6] = coded_block_flag;
    break;
  case 0xd:
    piVar1 = local_260->coded_block_flag[2] + (idx << 2);
    *piVar1 = coded_block_flag;
    piVar1[1] = coded_block_flag;
    piVar1[2] = coded_block_flag;
    piVar1[3] = coded_block_flag;
  }
  if (coded_block_flag == 0) {
    uVar9 = 0;
    do {
      if (uVar11 == uVar9) {
        return 0;
      }
      if (str->dir == VS_ENCODE) {
        if (block[uVar9] != 0) {
          fwrite("Non-zero coordinate in a skipped block!\n",0x28,1,_stderr);
          return 1;
        }
      }
      else {
        block[uVar9] = 0;
      }
      uVar9 = uVar9 + 1;
    } while( true );
  }
  if (local_260->mb_field_decoding_flag == 0) {
    uVar4 = (uint)(local_258->slice->field_pic_flag != 0);
  }
  else {
    uVar4 = 1;
  }
  local_260 = (h264_macroblock *)CONCAT44(local_260._4_4_,uVar4);
  memset(significant_coeff_flag,0,0x100);
  memset(last_significant_coeff_flag,0,0x100);
  uVar9 = (ulong)start;
  if (str->dir == VS_ENCODE) {
    uVar8 = 0xffffffffffffffff;
    for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
      if (block[uVar7] == 0) {
        significant_coeff_flag[uVar7] = 0;
      }
      else {
        if (((long)uVar7 < (long)uVar9) || ((long)end < (long)uVar7)) {
          fwrite("Non-zero coordinate outside start..end!\n",0x28,1,_stderr);
          return 1;
        }
        significant_coeff_flag[uVar7] = 1;
        uVar8 = uVar7 & 0xffffffff;
      }
      last_significant_coeff_flag[uVar7] = 0;
    }
    if ((int)uVar8 == -1) {
      __assert_fail("last != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/vstream/h264_residual.c"
                    ,0xce,
                    "int h264_residual_cabac(struct bitstream *, struct h264_cabac_context *, struct h264_slice *, struct h264_macroblock *, int32_t *, int, int, int, int, int, int)"
                   );
    }
    last_significant_coeff_flag[(int)uVar8] = 1;
  }
  local_240 = (ulong)(end + 1);
  local_268 = cat;
  local_248 = uVar9;
  do {
    lVar12 = (long)((int)local_240 + -1);
    lVar6 = uVar9 << 2;
    uVar8 = uVar9;
    while( true ) {
      uVar9 = uVar8 + 1;
      if (lVar12 <= (long)uVar8) {
        significant_coeff_flag[lVar12] = 1;
        if (str->dir == VS_DECODE) {
          for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
            block[uVar9] = 0;
          }
        }
        lVar6 = (long)(int)local_240;
        iVar3 = 0;
        numgt1 = 0;
        while( true ) {
          cabac_00 = local_258;
          lVar12 = lVar6;
          do {
            if (lVar12 <= (long)local_248) {
              return 0;
            }
            lVar6 = lVar12 + -1;
            lVar2 = lVar12 + -1;
            lVar12 = lVar6;
          } while (significant_coeff_flag[lVar2] == 0);
          uVar4 = block[lVar6];
          uVar10 = -uVar4;
          if (0 < (int)uVar4) {
            uVar10 = uVar4;
          }
          cam1 = uVar10 - 1;
          s = uVar4 >> 0x1f;
          iVar5 = h264_coeff_abs_level_minus1(str,local_258,local_268,iVar3,numgt1,&cam1);
          if (iVar5 != 0) break;
          iVar5 = h264_cabac_bypass(str,cabac_00,&s);
          if (iVar5 != 0) {
            return 1;
          }
          if (str->dir == VS_DECODE) {
            uVar4 = ~cam1;
            if (s == 0) {
              uVar4 = cam1 + 1;
            }
            block[lVar6] = uVar4;
          }
          iVar3 = iVar3 + (uint)(cam1 == 0);
          numgt1 = numgt1 + (uint)(cam1 != 0);
        }
        return 1;
      }
      iVar3 = h264_significant_coeff_flag
                        (str,local_258,(int)local_260,local_268,(int)uVar9 + -1,0,
                         (uint32_t *)((long)significant_coeff_flag + lVar6));
      if (iVar3 != 0) {
        return 1;
      }
      if (significant_coeff_flag[uVar8] != 0) break;
      lVar6 = lVar6 + 4;
      uVar8 = uVar9;
    }
    iVar3 = h264_significant_coeff_flag
                      (str,local_258,(int)local_260,local_268,(int)uVar9 + -1,1,
                       (uint32_t *)((long)last_significant_coeff_flag + lVar6));
    if (iVar3 != 0) {
      return 1;
    }
    if (significant_coeff_flag[uVar8 + 0x40] != 0) {
      local_240 = uVar9;
    }
    local_240 = local_240 & 0xffffffff;
  } while( true );
}

Assistant:

int h264_residual_cabac(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb, int32_t *block, int cat, int idx, int start, int end, int maxnumcoeff, int coded) {
	int i;
	uint32_t coded_block_flag = 0;
	for (i = 0 ; i < maxnumcoeff; i++)
		if (block[i])
			coded_block_flag = 1;
	if (coded) {
		if (maxnumcoeff != 64 || slice->chroma_array_type == 3) {
			if (h264_coded_block_flag(str, cabac, cat, idx, &coded_block_flag)) return 1;
		} else {
			if (vs_infer(str, &coded_block_flag, 1)) return 1;
		}
	} else {
		if (vs_infer(str, &coded_block_flag, 0)) return 1;
	}
	switch (cat) {
		case H264_CTXBLOCKCAT_LUMA_DC:
			mb->coded_block_flag[0][16] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_LUMA_AC:
		case H264_CTXBLOCKCAT_LUMA_4X4:
			mb->coded_block_flag[0][idx] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_LUMA_8X8:
			mb->coded_block_flag[0][idx * 4 + 0] = coded_block_flag;
			mb->coded_block_flag[0][idx * 4 + 1] = coded_block_flag;
			mb->coded_block_flag[0][idx * 4 + 2] = coded_block_flag;
			mb->coded_block_flag[0][idx * 4 + 3] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CB_DC:
			mb->coded_block_flag[1][16] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CB_AC:
		case H264_CTXBLOCKCAT_CB_4X4:
			mb->coded_block_flag[1][idx] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CB_8X8:
			mb->coded_block_flag[1][idx * 4 + 0] = coded_block_flag;
			mb->coded_block_flag[1][idx * 4 + 1] = coded_block_flag;
			mb->coded_block_flag[1][idx * 4 + 2] = coded_block_flag;
			mb->coded_block_flag[1][idx * 4 + 3] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CR_DC:
			mb->coded_block_flag[2][16] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CR_AC:
		case H264_CTXBLOCKCAT_CR_4X4:
			mb->coded_block_flag[2][idx] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CR_8X8:
			mb->coded_block_flag[2][idx * 4 + 0] = coded_block_flag;
			mb->coded_block_flag[2][idx * 4 + 1] = coded_block_flag;
			mb->coded_block_flag[2][idx * 4 + 2] = coded_block_flag;
			mb->coded_block_flag[2][idx * 4 + 3] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CHROMA_DC:
			mb->coded_block_flag[idx+1][16] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CHROMA_AC:
			mb->coded_block_flag[(idx >> 3)+1][idx & 7] = coded_block_flag;
			break;
		default:
			abort();
	}
	if (coded_block_flag) {
		int field = mb->mb_field_decoding_flag || cabac->slice->field_pic_flag;
		uint32_t significant_coeff_flag[64] = { 0 };
		uint32_t last_significant_coeff_flag[64] = { 0 };
		if (str->dir == VS_ENCODE) {
			int last = -1;
			for (i = 0; i < maxnumcoeff; i++) {
				if (block[i]) {
					if (i < start || i > end) {
						fprintf (stderr, "Non-zero coordinate outside start..end!\n");
						return 1;
					}
					significant_coeff_flag[i] = 1;
					last = i;
				} else {
					significant_coeff_flag[i] = 0;
				}
				last_significant_coeff_flag[i] = 0;
			}
			assert(last != -1);
			last_significant_coeff_flag[last] = 1;
		}
		int numcoeff = end + 1;
		for (i = start; i < numcoeff - 1; i++) {
			if (h264_significant_coeff_flag(str, cabac, field, cat, i, 0, &significant_coeff_flag[i])) return 1;
			if (significant_coeff_flag[i]) {
				if (h264_significant_coeff_flag(str, cabac, field, cat, i, 1, &last_significant_coeff_flag[i])) return 1;
				if (last_significant_coeff_flag[i]) {
					numcoeff = i + 1;
				}
			}
		}
		significant_coeff_flag[numcoeff-1] = 1;
		if (str->dir == VS_DECODE) {
			for (i = 0; i < maxnumcoeff; i++)
				block[i] = 0;
		}
		int num1 = 0, numgt1 = 0;
		for (i = numcoeff - 1; i >= start; i--) {
			if (significant_coeff_flag[i]) {
				int32_t cam1 = abs(block[i]) - 1;
				uint32_t s = block[i] < 0;
				if (h264_coeff_abs_level_minus1(str, cabac, cat, num1, numgt1, &cam1)) return 1;
				if (h264_cabac_bypass(str, cabac, &s)) return 1;
				if (cam1)
					numgt1++;
				else
					num1++;
				if (str->dir == VS_DECODE)
					block[i] = (s ? -(cam1 + 1) : cam1 + 1);
			}
		}
	} else {
		for (i = 0; i < maxnumcoeff; i++) {
			if (str->dir == VS_ENCODE) {
				if (block[i]) {
					fprintf(stderr, "Non-zero coordinate in a skipped block!\n");
					return 1;
				}
			} else {
				block[i] = 0;
			}
		}
	}
	return 0;
}